

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O3

Error __thiscall asmjit::VMemMgr::release(VMemMgr *this,void *p)

{
  uint8_t *p_00;
  RbNode *pRVar1;
  pthread_mutex_t *ppVar2;
  long *plVar3;
  long lVar4;
  MemNode *pMVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  pthread_mutex_t *ppVar10;
  int iVar11;
  Error EVar12;
  ulong uVar13;
  pthread_mutex_t *ppVar14;
  ulong uVar15;
  ulong uVar16;
  pthread_mutex_t *ppVar17;
  pthread_mutex_t *ppVar18;
  pthread_mutex_t *ppVar19;
  MemNode *pMVar20;
  ulong uVar21;
  ulong *puVar22;
  long extraout_RDX;
  RbNode *save;
  ulong *puVar23;
  long *plVar24;
  RbNode *root;
  undefined8 *puVar25;
  long lVar26;
  RbNode *pRVar27;
  MemNode **ppMVar28;
  ulong uVar29;
  asmjit *paVar30;
  long *plVar31;
  pthread_mutex_t *ppVar32;
  bool bVar33;
  undefined1 local_58 [40];
  
  if (p == (void *)0x0) {
    return 0;
  }
  pthread_mutex_lock((pthread_mutex_t *)this);
  EVar12 = 3;
  for (ppVar32 = (pthread_mutex_t *)this->_root; ppVar32 != (pthread_mutex_t *)0x0;
      ppVar32 = (pthread_mutex_t *)ppVar32->__align) {
    p_00 = *(uint8_t **)&(ppVar32->__data).__kind;
    if (p_00 <= p) {
      if (p < p_00 + *(long *)((long)ppVar32 + 0x30)) {
        lVar26 = 0;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = *(ulong *)((long)ppVar32 + 0x48);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = (long)p - (long)p_00;
        uVar21 = SUB168(auVar8 / auVar6,0) >> 3 & 0xfffffffffffffff8;
        puVar23 = (ulong *)(*(long *)((long)ppVar32 + 0x58) + uVar21);
        puVar22 = (ulong *)(uVar21 + *(long *)((long)ppVar32 + 0x60));
        uVar21 = 1L << (SUB161(auVar8 / auVar6,0) & 0x3f);
        goto LAB_001186f1;
      }
      ppVar32 = (pthread_mutex_t *)&(ppVar32->__data).__owner;
    }
  }
  goto LAB_001189fa;
LAB_001186f1:
  uVar13 = *puVar23;
  uVar16 = *puVar22;
  do {
    uVar29 = uVar21;
    uVar15 = uVar16;
    uVar13 = uVar13 & ~uVar29;
    uVar16 = ~uVar29 & uVar15;
    lVar26 = lVar26 + 1;
    if ((uVar29 & uVar15) == 0) break;
    uVar21 = uVar29 * 2;
  } while (uVar29 * 2 != 0);
  *puVar23 = uVar13;
  *puVar22 = uVar16;
  if ((uVar29 & uVar15) == 0) goto LAB_00118734;
  puVar23 = puVar23 + 1;
  puVar22 = puVar22 + 1;
  uVar21 = 1;
  goto LAB_001186f1;
LAB_00118734:
  root = *(RbNode **)((long)ppVar32 + 0x30);
  pRVar1 = *(RbNode **)((long)ppVar32 + 0x38);
  if (pRVar1 == root) {
    ppVar17 = (pthread_mutex_t *)this->_optimal;
    do {
      ppVar17 = (pthread_mutex_t *)(ppVar17->__data).__list.__next;
      if (ppVar17 == ppVar32) {
        this->_optimal = (MemNode *)ppVar32;
        break;
      }
    } while (ppVar17 != (pthread_mutex_t *)0x0);
  }
  pRVar27 = (RbNode *)(lVar26 * *(long *)((long)ppVar32 + 0x48));
  if ((RbNode *)ppVar32[2].__align < pRVar27) {
    ppVar32[2].__align = (long)pRVar27;
  }
  *(long *)((long)ppVar32 + 0x38) = (long)pRVar1 - (long)pRVar27;
  this->_usedBytes = this->_usedBytes - (long)pRVar27;
  if (pRVar1 != pRVar27) {
LAB_001189f8:
    EVar12 = 0;
LAB_001189fa:
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return EVar12;
  }
  OSUtils::releaseVirtualMemory(p_00,(size_t)root);
  ppVar17 = *(pthread_mutex_t **)((long)ppVar32 + 0x58);
  free(ppVar17);
  *(long *)((long)ppVar32 + 0x58) = 0;
  *(long *)((long)ppVar32 + 0x60) = 0;
  this->_allocatedBytes = this->_allocatedBytes - *(long *)((long)ppVar32 + 0x30);
  local_58._16_8_ = 0;
  local_58._24_8_ = (__pthread_internal_list *)0x0;
  local_58._0_8_ = 0;
  local_58._8_8_ = this->_root;
  if ((pthread_mutex_t *)local_58._8_8_ != (pthread_mutex_t *)0x0) {
    paVar30 = (asmjit *)(local_58 + 8);
    ppVar14 = (pthread_mutex_t *)0x0;
    ppVar18 = (pthread_mutex_t *)0x0;
    ppVar2 = (pthread_mutex_t *)local_58;
    uVar21 = 1;
    ppVar10 = (pthread_mutex_t *)local_58._8_8_;
    do {
      ppVar17 = ppVar10;
      ppVar19 = ppVar2;
      root = *(RbNode **)&(ppVar32->__data).__kind;
      uVar13 = (ulong)(*(RbNode **)&(ppVar17->__data).__kind < root);
      if (ppVar17 == ppVar32) {
        ppVar14 = ppVar17;
      }
      if ((*(uint32_t *)&(ppVar17->__data).__list.__prev == 0) &&
         ((lVar26 = *(long *)((long)ppVar17 + uVar13 * 8), lVar26 == 0 ||
          (*(int *)(lVar26 + 0x18) == 0)))) {
        uVar16 = (ulong)(root <= *(RbNode **)&(ppVar17->__data).__kind);
        ppVar2 = *(pthread_mutex_t **)((long)ppVar17 + uVar16 * 8);
        if ((ppVar2 == (pthread_mutex_t *)0x0) ||
           (*(uint32_t *)&(ppVar2->__data).__list.__prev == 0)) {
          uVar16 = (ulong)((uint)uVar21 ^ 1);
          plVar31 = *(long **)((long)ppVar19 + uVar16 * 8);
          if (plVar31 != (long *)0x0) {
            if ((plVar31[uVar16] == 0) || (*(int *)(plVar31[uVar16] + 0x18) == 0)) {
              if ((plVar31[uVar21] != 0) && (*(int *)(plVar31[uVar21] + 0x18) != 0)) {
                bVar33 = *(pthread_mutex_t **)&(ppVar18->__data).__owner == ppVar19;
                goto LAB_001188b2;
              }
              *(uint32_t *)&(ppVar19->__data).__list.__prev = 0;
              *(undefined4 *)(plVar31 + 3) = 1;
              *(uint32_t *)&(ppVar17->__data).__list.__prev = 1;
            }
            else {
              plVar24 = plVar31 + uVar21;
              lVar26 = *plVar24;
              bVar33 = *(pthread_mutex_t **)&(ppVar18->__data).__owner == ppVar19;
              if ((lVar26 != 0) && (*(int *)(lVar26 + 0x18) != 0)) {
LAB_001188b2:
                plVar3 = (long *)plVar31[uVar21];
                plVar31[uVar21] = plVar3[uVar16];
                plVar3[uVar16] = (long)plVar31;
                *(undefined4 *)(plVar31 + 3) = 1;
                *(long **)((long)ppVar19 + uVar16 * 8) = plVar3;
                plVar24 = plVar3 + uVar21;
                lVar26 = *plVar24;
                plVar31 = plVar3;
              }
              *(long *)((long)ppVar19 + uVar16 * 8) = lVar26;
              *plVar24 = (long)ppVar19;
              *(uint32_t *)&(ppVar19->__data).__list.__prev = 1;
              *(long **)((long)ppVar18 + (ulong)bVar33 * 8) = plVar31;
              lVar26 = *plVar31;
              lVar4 = plVar31[1];
              *(undefined4 *)(plVar31 + 3) = 1;
              *(uint32_t *)&(ppVar17->__data).__list.__prev = 1;
              root = (RbNode *)0x0;
              *(undefined4 *)(lVar26 + 0x18) = 0;
              *(undefined4 *)(lVar4 + 0x18) = 0;
            }
          }
        }
        else {
          *(long *)((long)ppVar17 + uVar16 * 8) = *(long *)((long)ppVar2 + uVar13 * 8);
          *(pthread_mutex_t **)((long)ppVar2 + uVar13 * 8) = ppVar17;
          *(uint32_t *)&(ppVar17->__data).__list.__prev = 1;
          *(uint32_t *)&(ppVar2->__data).__list.__prev = 0;
          *(pthread_mutex_t **)paVar30 = ppVar2;
          ppVar19 = ppVar2;
        }
      }
      paVar30 = (asmjit *)((long)ppVar17 + uVar13 * 8);
      ppVar18 = ppVar19;
      ppVar2 = ppVar17;
      uVar21 = uVar13;
      ppVar10 = *(pthread_mutex_t **)paVar30;
    } while (*(pthread_mutex_t **)paVar30 != (pthread_mutex_t *)0x0);
    if (ppVar14 != (pthread_mutex_t *)0x0) {
      if (ppVar14 == (pthread_mutex_t *)local_58) {
        release();
LAB_00118a18:
        release();
      }
      else {
        if (ppVar17 == (pthread_mutex_t *)local_58) goto LAB_00118a18;
        if (ppVar14 != ppVar17) {
          *(uint8_t **)&(ppVar14->__data).__kind = *(uint8_t **)&(ppVar17->__data).__kind;
          lVar26 = *(long *)((long)ppVar17 + 0x38);
          *(long *)((long)ppVar14 + 0x30) = *(long *)((long)ppVar17 + 0x30);
          *(long *)((long)ppVar14 + 0x38) = lVar26;
          lVar26 = *(long *)((long)ppVar17 + 0x48);
          *(long *)((long)ppVar14 + 0x40) = *(long *)((long)ppVar17 + 0x40);
          *(long *)((long)ppVar14 + 0x48) = lVar26;
          ppVar14[2].__align = ppVar17[2].__align;
          lVar26 = *(long *)((long)ppVar17 + 0x60);
          *(long *)((long)ppVar14 + 0x58) = *(long *)((long)ppVar17 + 0x58);
          *(long *)((long)ppVar14 + 0x60) = lVar26;
        }
        *(long *)((long)ppVar19 +
                 (ulong)(*(pthread_mutex_t **)&(ppVar19->__data).__owner == ppVar17) * 8) =
             *(long *)((long)ppVar17 + (ulong)(ppVar17->__align == 0) * 8);
        this->_root = (MemNode *)local_58._8_8_;
        if ((pthread_mutex_t *)local_58._8_8_ != (pthread_mutex_t *)0x0) {
          *(undefined4 *)(local_58._8_8_ + 0x18) = 0;
        }
        pMVar5 = (MemNode *)(ppVar17->__data).__list.__next;
        pMVar20 = (MemNode *)ppVar17[1].__align;
        root = (RbNode *)&pMVar5->next;
        if (pMVar5 == (MemNode *)0x0) {
          root = (RbNode *)&this->_first;
        }
        ppMVar28 = &pMVar20->prev;
        if (pMVar20 == (MemNode *)0x0) {
          ppMVar28 = &this->_last;
        }
        root->node[0] = (RbNode *)pMVar20;
        *ppMVar28 = pMVar5;
        if ((pthread_mutex_t *)this->_optimal == ppVar17) {
          if (pMVar5 != (MemNode *)0x0) {
            pMVar20 = pMVar5;
          }
          this->_optimal = pMVar20;
        }
        free(ppVar17);
        ppVar17 = (pthread_mutex_t *)this->_root;
        iVar11 = rbAssert((asmjit *)&ppVar17->__data,root);
        if (0 < iVar11) goto LAB_001189f8;
      }
      release();
    }
  }
  release();
  if (root == (RbNode *)0x0) {
    return 0;
  }
  if (extraout_RDX == 0) {
    EVar12 = release((VMemMgr *)&ppVar17->__data,root);
    return EVar12;
  }
  pthread_mutex_lock(ppVar17);
  for (puVar25 = (undefined8 *)ppVar17[2].__align; EVar12 = 3, puVar25 != (undefined8 *)0x0;
      puVar25 = (undefined8 *)*puVar25) {
    pRVar1 = (RbNode *)puVar25[2];
    if (pRVar1 <= root) {
      if (root < (RbNode *)((long)pRVar1->node + puVar25[6])) {
        uVar21 = puVar25[9];
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar21;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (long)root - (long)pRVar1;
        uVar15 = SUB168(auVar9 / auVar7,0);
        uVar16 = 1L << (SUB161(auVar9 / auVar7,0) & 0x3f);
        uVar29 = uVar15 >> 6;
        uVar13 = *(ulong *)(puVar25[0xc] + uVar29 * 8);
        uVar21 = ((extraout_RDX + uVar21) - 1) / uVar21;
        EVar12 = 0;
        if ((uVar13 >> (uVar15 & 0x3f) & 1) != 0) {
          puVar22 = (ulong *)(puVar25[0xc] + uVar29 * 8);
          puVar23 = (ulong *)(puVar25[0xb] + uVar29 * 8);
          uVar15 = *puVar23;
          goto LAB_00118aeb;
        }
        break;
      }
      puVar25 = puVar25 + 1;
    }
  }
  goto LAB_00118b82;
LAB_00118b16:
  uVar13 = ~uVar16 & uVar13;
  uVar16 = uVar16 * 2;
  if ((bool)(uVar16 == 0 | bVar33)) {
    *puVar23 = uVar15;
    *puVar22 = uVar13;
    if (bVar33) goto LAB_00118b68;
    uVar15 = puVar23[1];
    puVar23 = puVar23 + 1;
    uVar13 = puVar22[1];
    puVar22 = puVar22 + 1;
    uVar16 = 1;
  }
  bVar33 = (uVar16 & uVar13) == 0;
  uVar15 = uVar15 & ~uVar16;
  lVar26 = lVar26 + 1;
  goto LAB_00118b16;
LAB_00118b68:
  uVar21 = lVar26 * puVar25[9];
  if ((ulong)puVar25[10] < uVar21) {
    puVar25[10] = uVar21;
  }
  puVar25[7] = puVar25[7] - uVar21;
  *(long *)((long)ppVar17 + 0x48) = *(long *)((long)ppVar17 + 0x48) - uVar21;
  EVar12 = 0;
  goto LAB_00118b82;
  while( true ) {
    uVar16 = uVar16 * 2;
    if (uVar16 == 0) {
      uVar15 = puVar23[1];
      puVar23 = puVar23 + 1;
      uVar13 = puVar22[1];
      puVar22 = puVar22 + 1;
      uVar16 = 1;
    }
    EVar12 = 0;
    if ((uVar16 & uVar13) == 0) break;
LAB_00118aeb:
    uVar21 = uVar21 - 1;
    if (uVar21 == 0) {
      lVar26 = 0;
      bVar33 = false;
      goto LAB_00118b16;
    }
  }
LAB_00118b82:
  pthread_mutex_unlock(ppVar17);
  return EVar12;
}

Assistant:

Error VMemMgr::release(void* p) noexcept {
  if (!p) return kErrorOk;

  AutoLock locked(_lock);
  MemNode* node = vMemMgrFindNodeByPtr(this, static_cast<uint8_t*>(p));
  if (!node) return DebugUtils::errored(kErrorInvalidArgument);

  size_t offset = (size_t)((uint8_t*)p - (uint8_t*)node->mem);
  size_t bitpos = M_DIV(offset, node->density);
  size_t i = (bitpos / kBitsPerEntity);

  size_t* up = node->baUsed + i;  // Current ubits address.
  size_t* cp = node->baCont + i;  // Current cbits address.
  size_t ubits = *up;             // Current ubits[0] value.
  size_t cbits = *cp;             // Current cbits[0] value.
  size_t bit = (size_t)1 << (bitpos % kBitsPerEntity);

  size_t cont = 0;
  bool stop;

  for (;;) {
    stop = (cbits & bit) == 0;
    ubits &= ~bit;
    cbits &= ~bit;

    bit <<= 1;
    cont++;

    if (stop || bit == 0) {
      *up = ubits;
      *cp = cbits;
      if (stop)
        break;

      ubits = *++up;
      cbits = *++cp;
      bit = 1;
    }
  }

  // If the freed block is fully allocated node then it's needed to
  // update 'optimal' pointer in memory manager.
  if (node->used == node->size) {
    MemNode* cur = _optimal;

    do {
      cur = cur->prev;
      if (cur == node) {
        _optimal = node;
        break;
      }
    } while (cur);
  }

  // Statistics.
  cont *= node->density;
  if (node->largestBlock < cont)
    node->largestBlock = cont;

  node->used -= cont;
  _usedBytes -= cont;

  // If page is empty, we can free it.
  if (node->used == 0) {
    // Free memory associated with node (this memory is not accessed
    // anymore so it's safe).
    vMemMgrReleaseVMem(this, node->mem, node->size);
    Internal::releaseMemory(node->baUsed);

    node->baUsed = nullptr;
    node->baCont = nullptr;

    // Statistics.
    _allocatedBytes -= node->size;

    // Remove node. This function can return different node than
    // passed into, but data is copied into previous node if needed.
    Internal::releaseMemory(vMemMgrRemoveNode(this, node));
    ASMJIT_ASSERT(vMemMgrCheckTree(this));
  }

  return kErrorOk;
}